

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgd-walk.c
# Opt level: O2

void print_task_struct(nettlp *nt,task_struct t)

{
  byte bVar1;
  ulong uVar2;
  char *__format;
  long state;
  char comm [16];
  
  uVar2 = dma_read(nt,t.pstate,&state,8);
  if ((uVar2 & 0xfffffff8) == 0) {
    __format = "failed to read state from %#lx\n";
    t.pcomm = t.pstate;
  }
  else {
    uVar2 = dma_read(nt,t.pcomm,comm,0x10);
    if ((uVar2 & 0xfffffff0) != 0) {
      comm[0xf] = '\0';
      bVar1 = state_to_char(state);
      printf("%#lx %6d    %c 0x%04lx %s, pgd is %#lx\n",t.phead,(ulong)(uint)t.pid,(ulong)bVar1,
             state,comm,t.pgd);
      return;
    }
    __format = "failed to read comm from %#lx\n";
  }
  fprintf(_stderr,__format,t.pcomm);
  return;
}

Assistant:

void print_task_struct(struct nettlp *nt, struct task_struct t)
{
	int ret;
	long state;
	char comm[TASK_COMM_LEN];

	ret = dma_read(nt, t.pstate, &state, sizeof(state));
	if (ret < sizeof(state)) {
		fprintf(stderr, "failed to read state from %#lx\n", t.pstate);
		return;
	}

	ret = dma_read(nt, t.pcomm, &comm, sizeof(comm));
	if (ret < sizeof(comm)) {
		fprintf(stderr, "failed to read comm from %#lx\n", t.pcomm);
		return;
	}

	comm[TASK_COMM_LEN - 1] = '\0';	/* preventing overflow */

	printf("%#lx %6d    %c 0x%04lx %s, pgd is %#lx\n",
	       t.phead, t.pid, state_to_char(state), state, comm, t.pgd);
}